

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall TxConfirmStats::Write(TxConfirmStats *this,AutoFile *fileout)

{
  size_t in_RCX;
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *v_00;
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_const_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_object =
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)EncodeDouble(this->decay);
  AutoFile::write(fileout,(int)&local_28,&DAT_00000008,in_RCX);
  local_28.m_object._0_4_ = this->scale;
  AutoFile::write(fileout,(int)&local_28,(void *)0x4,in_RCX);
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
  Ser<AutoFile,std::vector<double,std::allocator<double>>>
            ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)fileout,
             (AutoFile *)&this->m_feerate_avg,v);
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
  Ser<AutoFile,std::vector<double,std::allocator<double>>>
            ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)fileout,
             (AutoFile *)&this->txCtAvg,v_00);
  local_28.m_object = &this->confAvg;
  AutoFile::operator<<(fileout,&local_28);
  local_28.m_object = &this->failAvg;
  AutoFile::operator<<(fileout,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Write(AutoFile& fileout) const
{
    fileout << Using<EncodedDoubleFormatter>(decay);
    fileout << scale;
    fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(m_feerate_avg);
    fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(txCtAvg);
    fileout << Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(confAvg);
    fileout << Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(failAvg);
}